

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O3

void __thiscall interpreter::Interpreter::Run(Interpreter *this,string *data)

{
  undefined8 uVar1;
  _func_int **pp_Var2;
  element_type *this_00;
  undefined1 auVar3 [8];
  undefined1 auVar4 [8];
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  shared_ptr<ScriptAstNode> script;
  undefined1 auStack_38 [8];
  shared_ptr<bytecode::CompiledFile> compiledFile;
  
  parseScript((ostream *)&local_58,*(string **)this);
  this_00 = script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_58;
  if (script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               statements).
               super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&((script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    statements).
                    super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&((script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               statements).
               super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&((script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    statements).
                    super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  compile((shared_ptr<ScriptAstNode> *)auStack_38);
  if (this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  uVar1 = *(undefined8 *)this;
  pp_Var2 = *(_func_int ***)(this + 8);
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xa0);
  peVar5 = compiledFile.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar3 = auStack_38;
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00130d10;
  auStack_38 = (undefined1  [8])0x0;
  auVar4 = auStack_38;
  compiledFile.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)&PTR__VirtualMachine_00130d60;
  auStack_38._0_4_ = auVar3._0_4_;
  auStack_38._4_4_ = auVar3._4_4_;
  this_01[1]._M_use_count = auStack_38._0_4_;
  this_01[1]._M_weak_count = auStack_38._4_4_;
  this_01[2]._vptr__Sp_counted_base = (_func_int **)peVar5;
  this_01[2]._M_use_count = 0;
  this_01[2]._M_weak_count = 0;
  this_01[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  auStack_38 = auVar4;
  runtime::Heap::Heap((Heap *)&this_01[3]._M_use_count,(VirtualMachine *)(this_01 + 1));
  this_01[8]._M_use_count = (int)uVar1;
  this_01[8]._M_weak_count = (int)((ulong)uVar1 >> 0x20);
  this_01[9]._vptr__Sp_counted_base = pp_Var2;
  *(undefined2 *)&this_01[9]._M_use_count = 0;
  runtime::VirtualMachine::run((VirtualMachine *)(this_01 + 1));
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  if (compiledFile.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               compiledFile.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  if (script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void interpreter::Interpreter::Run(const std::string & data) {

  std::shared_ptr<ScriptAstNode> script = parseScript(this->out, data);
  auto compiledFile = compile(script);
  auto runtime = std::make_shared<runtime::VirtualMachine>(false, this->out, this->in, std::move(compiledFile));
  runtime->run();
}